

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

int __thiscall Catch::TablePrinter::open(TablePrinter *this,char *__file,int __oflag,...)

{
  pointer pCVar1;
  int in_EAX;
  int extraout_EAX;
  Column *__x;
  ostream *poVar2;
  ostream *poVar3;
  pointer text;
  Columns headerCols;
  Spacer spacer;
  Column local_60;
  
  if (this->m_isOpen == false) {
    this->m_isOpen = true;
    Catch::operator<<();
    headerCols.m_columns.
    super__Vector_base<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    headerCols.m_columns.
    super__Vector_base<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    headerCols.m_columns.
    super__Vector_base<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    clara::TextFlow::Spacer::Spacer(&spacer,2);
    pCVar1 = (this->m_columnInfos).
             super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (text = (this->m_columnInfos).
                super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
                ._M_impl.super__Vector_impl_data._M_start; text != pCVar1; text = text + 1) {
      clara::TextFlow::Column::Column(&local_60,&text->name);
      __x = clara::TextFlow::Column::width(&local_60,(long)text->width - 2);
      clara::std::
      vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>::
      push_back(&headerCols.m_columns,__x);
      clara::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_60.m_strings);
      clara::std::
      vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>::
      push_back(&headerCols.m_columns,&spacer.super_Column);
    }
    poVar2 = clara::TextFlow::operator<<(this->m_os,&headerCols);
    std::operator<<((ostream *)poVar2,'\n');
    if (getLineOfChars<(char)45>()::line == '\0') {
      uRam0000000000185340 = 0x2d2d2d2d2d2d2d;
      uRam0000000000185347._0_1_ = '-';
      uRam0000000000185347._1_1_ = '-';
      uRam0000000000185347._2_1_ = '-';
      uRam0000000000185347._3_1_ = '-';
      uRam0000000000185347._4_1_ = '-';
      uRam0000000000185347._5_1_ = '-';
      uRam0000000000185347._6_1_ = '-';
      uRam0000000000185347._7_1_ = '-';
      DAT_00185330 = '-';
      DAT_00185330_1._0_1_ = '-';
      DAT_00185330_1._1_1_ = '-';
      DAT_00185330_1._2_1_ = '-';
      DAT_00185330_1._3_1_ = '-';
      DAT_00185330_1._4_1_ = '-';
      DAT_00185330_1._5_1_ = '-';
      DAT_00185330_1._6_1_ = '-';
      uRam0000000000185338 = 0x2d2d2d2d2d2d2d;
      DAT_0018533f = 0x2d;
      DAT_00185320 = '-';
      DAT_00185320_1._0_1_ = '-';
      DAT_00185320_1._1_1_ = '-';
      DAT_00185320_1._2_1_ = '-';
      DAT_00185320_1._3_1_ = '-';
      DAT_00185320_1._4_1_ = '-';
      DAT_00185320_1._5_1_ = '-';
      DAT_00185320_1._6_1_ = '-';
      uRam0000000000185328._0_1_ = '-';
      uRam0000000000185328._1_1_ = '-';
      uRam0000000000185328._2_1_ = '-';
      uRam0000000000185328._3_1_ = '-';
      uRam0000000000185328._4_1_ = '-';
      uRam0000000000185328._5_1_ = '-';
      uRam0000000000185328._6_1_ = '-';
      uRam0000000000185328._7_1_ = '-';
      DAT_00185310 = '-';
      DAT_00185310_1._0_1_ = '-';
      DAT_00185310_1._1_1_ = '-';
      DAT_00185310_1._2_1_ = '-';
      DAT_00185310_1._3_1_ = '-';
      DAT_00185310_1._4_1_ = '-';
      DAT_00185310_1._5_1_ = '-';
      DAT_00185310_1._6_1_ = '-';
      uRam0000000000185318._0_1_ = '-';
      uRam0000000000185318._1_1_ = '-';
      uRam0000000000185318._2_1_ = '-';
      uRam0000000000185318._3_1_ = '-';
      uRam0000000000185318._4_1_ = '-';
      uRam0000000000185318._5_1_ = '-';
      uRam0000000000185318._6_1_ = '-';
      uRam0000000000185318._7_1_ = '-';
      getLineOfChars<(char)45>()::line = '-';
      getLineOfChars<(char)45>()::line_1._0_1_ = '-';
      getLineOfChars<(char)45>()::line_1._1_1_ = '-';
      getLineOfChars<(char)45>()::line_1._2_1_ = '-';
      getLineOfChars<(char)45>()::line_1._3_1_ = '-';
      getLineOfChars<(char)45>()::line_1._4_1_ = '-';
      getLineOfChars<(char)45>()::line_1._5_1_ = '-';
      getLineOfChars<(char)45>()::line_1._6_1_ = '-';
      uRam0000000000185308._0_1_ = '-';
      uRam0000000000185308._1_1_ = '-';
      uRam0000000000185308._2_1_ = '-';
      uRam0000000000185308._3_1_ = '-';
      uRam0000000000185308._4_1_ = '-';
      uRam0000000000185308._5_1_ = '-';
      uRam0000000000185308._6_1_ = '-';
      uRam0000000000185308._7_1_ = '-';
      DAT_0018534f = 0;
    }
    poVar3 = std::operator<<((ostream *)this->m_os,&getLineOfChars<(char)45>()::line);
    std::operator<<(poVar3,'\n');
    clara::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&spacer);
    clara::std::
    vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>::~vector
              (&headerCols.m_columns);
    in_EAX = extraout_EAX;
  }
  return in_EAX;
}

Assistant:

void open() {
        if (!m_isOpen) {
            m_isOpen = true;
            *this << RowBreak();

			Columns headerCols;
			Spacer spacer(2);
			for (auto const& info : m_columnInfos) {
				headerCols += Column(info.name).width(static_cast<std::size_t>(info.width - 2));
				headerCols += spacer;
			}
			m_os << headerCols << '\n';

            m_os << Catch::getLineOfChars<'-'>() << '\n';
        }
    }